

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O1

void __thiscall Kernel::Clause::destroy(Clause *this)

{
  Inference *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  Clause *pCVar4;
  Iterator it;
  anon_union_8_2_756040a0_for_Iterator_0 local_38;
  
  if ((destroy()::toDestroy == '\0') &&
     (iVar3 = __cxa_guard_acquire(&destroy()::toDestroy), iVar3 != 0)) {
    destroy::toDestroy._capacity = 0x20;
    destroy::toDestroy._stack = (Clause **)::operator_new(0x100,0x10);
    destroy::toDestroy._end = destroy::toDestroy._stack + destroy::toDestroy._capacity;
    destroy::toDestroy._cursor = destroy::toDestroy._stack;
    __cxa_atexit(::Lib::Stack<Kernel::Clause_*>::~Stack,&destroy::toDestroy,&__dso_handle);
    __cxa_guard_release(&destroy()::toDestroy);
  }
  while( true ) {
    if (*(int *)(::Lib::env + 0x85a8) == 2) {
      ::Lib::ProofExtra::remove((ProofExtra *)&DAT_00b7e1d8,(char *)this);
    }
    this_00 = &(this->super_Unit)._inference;
    local_38 = (anon_union_8_2_756040a0_for_Iterator_0)Inference::iterator(this_00);
    while (bVar1 = Inference::hasNext(this_00,(Iterator *)&local_38), bVar1) {
      pCVar4 = (Clause *)Inference::next(this_00,(Iterator *)&local_38);
      if (((((pCVar4->super_Unit).field_0x4 & 1) == 0) &&
          (uVar2 = pCVar4->_refCnt - 1, pCVar4->_refCnt = uVar2,
          uVar2 == 0 && (*(uint *)&pCVar4->field_0x38 & 0xe000000) == 0x6000000)) &&
         (Unit::_firstNonPreprocessingNumber - 1 < (pCVar4->super_Unit)._number)) {
        if (destroy::toDestroy._cursor == destroy::toDestroy._end) {
          ::Lib::Stack<Kernel::Clause_*>::expand(&destroy::toDestroy);
        }
        *destroy::toDestroy._cursor = pCVar4;
        destroy::toDestroy._cursor = destroy::toDestroy._cursor + 1;
      }
    }
    Inference::destroyDirectlyOwned(this_00);
    destroyExceptInferenceObject(this);
    if (destroy::toDestroy._cursor == destroy::toDestroy._stack) break;
    this = destroy::toDestroy._cursor[-1];
    destroy::toDestroy._cursor = destroy::toDestroy._cursor + -1;
  }
  return;
}

Assistant:

void Clause::destroy()
{
  static Stack<Clause*> toDestroy(32);
  Clause* cl = this;
  for(;;) {
    if (env.options->proofExtra() == Options::ProofExtra::FULL) {
      env.proofExtra.remove(cl);
    }
    Inference::Iterator it = cl->_inference.iterator();
    while (cl->_inference.hasNext(it)) {
      Unit* refU = cl->_inference.next(it);
      if (!refU->isClause()) {
        continue;
      }
      Clause* refCl = static_cast<Clause*> (refU);
      refCl->_refCnt--;
      if (refCl->shouldBeDestroyed()) {
        toDestroy.push(refCl);
      }
    }
    cl->_inference.destroyDirectlyOwned();
    cl->destroyExceptInferenceObject();
    if (toDestroy.isEmpty()) {
      break;
    }
    cl = toDestroy.pop();
  }
}